

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O3

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitRefAs
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,RefAs *curr)

{
  RefAsOp RVar1;
  
  RVar1 = curr->op;
  if (RVar1 == ExternConvertAny) {
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,&curr->value,(Type)0x22);
    return;
  }
  if (RVar1 != AnyConvertExtern) {
    if (RVar1 == RefAsNonNull) {
      IRBuilder::ChildPopper::ConstraintCollector::noteAnyReferenceType
                ((ConstraintCollector *)this,&curr->value);
      return;
    }
    handle_unreachable("unexpected op",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                       ,0x40f);
  }
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->value,(Type)0xa);
  return;
}

Assistant:

void visitRefAs(RefAs* curr) {
    switch (curr->op) {
      case RefAsNonNull:
        noteAnyReference(&curr->value);
        return;
      case AnyConvertExtern:
        note(&curr->value, Type(HeapType::ext, Nullable));
        return;
      case ExternConvertAny:
        note(&curr->value, Type(HeapType::any, Nullable));
        return;
    }
    WASM_UNREACHABLE("unexpected op");
  }